

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

result * __thiscall
lest::expression_lhs<nonstd::byte_const&>::operator<
          (expression_lhs<const_nonstd::byte_&> *this,byte *rhs)

{
  type_conflict *in_RDX;
  undefined8 *in_RSI;
  result *in_RDI;
  string *in_stack_00000110;
  byte *in_stack_00000118;
  result *this_00;
  result *this_01;
  result *this_02;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [64];
  result local_68 [2];
  
  local_68[0]._38_1_ = *(type_conflict *)*in_RSI;
  local_68[0]._37_1_ = *in_RDX;
  this_02 = in_RDI;
  local_68[0]._39_1_ = nonstd::operator<((byte)local_68[0]._38_1_,(byte)local_68[0]._37_1_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"<",&local_c9);
  this_01 = (result *)local_a8;
  std::__cxx11::string::string((string *)this_01,local_c8);
  to_string<nonstd::byte,nonstd::byte>(in_stack_00000118,in_stack_00000110,(byte *)this);
  this_00 = local_68;
  std::__cxx11::string::string((string *)this_00,(string *)(local_a8 + 0x20));
  result::result<bool>(this_02,&in_RDI->passed,(text *)this_01);
  result::result(this_01,this_00);
  result::~result((result *)0x1309c2);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(local_a8 + 0x20));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return this_02;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }